

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# example3.cpp
# Opt level: O1

void __thiscall MyRTPSession::OnNewSource(MyRTPSession *this,RTPSourceData *dat)

{
  uint uVar1;
  RTPIPv4Address *addr;
  RTPAddress *pRVar2;
  char *__s;
  ostream *poVar3;
  RTPIPv4Address dest;
  allocator<char> local_51;
  long *local_50;
  long local_48;
  long local_40 [2];
  RTPAddress local_30;
  short local_20;
  short local_1e;
  
  if (dat->ownssrc == false) {
    pRVar2 = dat->rtpaddr;
    if (pRVar2 == (RTPAddress *)0x0) {
      pRVar2 = dat->rtcpaddr;
      if (pRVar2 == (RTPAddress *)0x0) {
        return;
      }
      local_20 = (short)*(undefined4 *)&pRVar2[1]._vptr_RTPAddress + -1;
    }
    else {
      local_20 = *(short *)&pRVar2[1]._vptr_RTPAddress;
    }
    uVar1 = *(uint *)&pRVar2->field_0xc;
    local_30.addresstype = IPv4Address;
    local_30._vptr_RTPAddress = (_func_int **)&PTR_CreateCopy_0013dbb0;
    local_1e = local_20 + 1;
    local_30._12_4_ = uVar1;
    jrtplib::RTPSession::AddDestination(&this->super_RTPSession,&local_30);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Adding destination ",0x13);
    __s = inet_ntoa((in_addr)(uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 |
                             uVar1 << 0x18));
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,__s,&local_51);
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cout,(char *)local_50,local_48);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,":",1);
    poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
    std::ostream::put((char)poVar3);
    std::ostream::flush();
    if (local_50 != local_40) {
      operator_delete(local_50,local_40[0] + 1);
    }
  }
  return;
}

Assistant:

void OnNewSource(RTPSourceData *dat)
	{
		if (dat->IsOwnSSRC())
			return;

		uint32_t ip;
		uint16_t port;
		
		if (dat->GetRTPDataAddress() != 0)
		{
			const RTPIPv4Address *addr = (const RTPIPv4Address *)(dat->GetRTPDataAddress());
			ip = addr->GetIP();
			port = addr->GetPort();
		}
		else if (dat->GetRTCPDataAddress() != 0)
		{
			const RTPIPv4Address *addr = (const RTPIPv4Address *)(dat->GetRTCPDataAddress());
			ip = addr->GetIP();
			port = addr->GetPort()-1;
		}
		else
			return;
		
		RTPIPv4Address dest(ip,port);
		AddDestination(dest);

		struct in_addr inaddr;
		inaddr.s_addr = htonl(ip);
		std::cout << "Adding destination " << std::string(inet_ntoa(inaddr)) << ":" << port << std::endl;
	}